

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_retention.pb.cc
# Opt level: O1

void __thiscall
proto2_unittest::TopLevelMessage_NestedMessage::TopLevelMessage_NestedMessage
          (TopLevelMessage_NestedMessage *this,Arena *arena,TopLevelMessage_NestedMessage *from)

{
  ulong uVar1;
  
  (this->super_ZeroFieldsBase).super_Message.super_MessageLite._internal_metadata_.ptr_ =
       (intptr_t)arena;
  (this->super_ZeroFieldsBase)._impl_._cached_size_.atom_ = 0;
  (this->super_ZeroFieldsBase).super_Message.super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ZeroFieldsBase_01965260;
  uVar1 = (from->super_ZeroFieldsBase).super_Message.super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&(this->super_ZeroFieldsBase).super_Message.super_MessageLite._internal_metadata_,
               (UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
  }
  return;
}

Assistant:

inline constexpr TopLevelMessage::Impl_::Impl_(
    ::_pbi::ConstantInitialized) noexcept
      : _cached_size_{0},
        f_{0},
        o_{},
        _oneof_case_{} {}